

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void usage(void)

{
  fprintf(_stderr,"usage: %s [options] archive [file ... file]\n",ourname);
  fprintf(_stderr,"       where options are:\n");
  fprintf(_stderr,"       -u or -x unarchive           -t test archive integrity\n");
  fprintf(_stderr,"       -l list archive contents     -q quiet\n");
  fprintf(_stderr,"       -f force file overwrite      -s no filestamp\n");
  fprintf(_stderr,"       -v verbose                   -V display version number\n");
  fprintf(_stderr,"       -R retry if archive corrupt  -L<name> set logfile name\n");
  fprintf(_stderr,"       -T append filetype to name   -C create lowercase filenames\n");
  fprintf(_stderr,"       -I unarchive with .inf files -p<password> set password\n");
  fprintf(_stderr,"       -c extract files to stdout\n");
  exit(1);
}

Assistant:

void
usage() 
{
	fprintf(stderr, "usage: %s [options] archive [file ... file]\n",
			 ourname);
	fprintf(stderr, "       where options are:\n");
	fprintf(stderr,
			 "       -u or -x unarchive           -t test archive integrity\n");
	fprintf(stderr, "       -l list archive contents     -q quiet\n");
	fprintf(stderr,
			 "       -f force file overwrite      -s no filestamp\n");
	fprintf(stderr,
			 "       -v verbose                   -V display version number\n");
	fprintf(stderr,
			 "       -R retry if archive corrupt  -L<name> set logfile name\n");
	fprintf(stderr,
			 "       -T append filetype to name   -C create lowercase filenames\n");
	
		/* MU added instuctions for the -I option */ 
	fprintf(stderr, "       -I unarchive with .inf files -p<password> set password\n");
	fprintf(stderr, "       -c extract files to stdout\n");
	exit(1);
}